

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O2

void __thiscall
chrono::ChLoadBodyBodyTorque::ChLoadBodyBodyTorque
          (ChLoadBodyBodyTorque *this,shared_ptr<chrono::ChBody> *bodyA,
          shared_ptr<chrono::ChBody> *bodyB,ChVector<double> *torque,bool param_4)

{
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> _Stack_108;
  __shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> local_f8;
  ChQuaternion<double> local_e8;
  ChVector<double> local_c8;
  ChFrame<double> local_a8;
  
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_f8,&bodyA->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_108,&bodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>);
  local_e8.m_data[0] = 1.0;
  local_c8.m_data[2] = 0.0;
  local_e8.m_data[3] = 0.0;
  local_c8.m_data[0] = 0.0;
  local_c8.m_data[1] = 0.0;
  local_e8.m_data[1] = 0.0;
  local_e8.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&local_a8,&local_c8,&local_e8);
  ChLoadBodyBody::ChLoadBodyBody
            (&this->super_ChLoadBodyBody,(shared_ptr<chrono::ChBody> *)&local_f8,
             (shared_ptr<chrono::ChBody> *)&_Stack_108,&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_108._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
  (this->super_ChLoadBodyBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLoadBodyBodyTorque_0116ce78;
  (this->m_torque).m_data[0] = torque->m_data[0];
  (this->m_torque).m_data[1] = torque->m_data[1];
  (this->m_torque).m_data[2] = torque->m_data[2];
  this->m_local_torque = param_4;
  (this->m_modulation).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x20);
  this->m_scale = 1.0;
  local_e8.m_data[0] = 1.0;
  std::make_shared<chrono::ChFunction_Const,double>((double *)&local_a8);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->m_modulation,
             (__shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.coord);
  return;
}

Assistant:

ChLoadBodyBodyTorque::ChLoadBodyBodyTorque(std::shared_ptr<ChBody> bodyA,
                                           std::shared_ptr<ChBody> bodyB,
                                           const ChVector<> torque,
                                           bool local_torque)
    : ChLoadBodyBody(bodyA, bodyB, ChFrame<>()), m_torque(torque), m_local_torque(local_torque), m_scale(1) {
    m_modulation = chrono_types::make_shared<ChFunction_Const>(1.0);
}